

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ciphercommon_gcm.c
# Opt level: O0

void ctr64_inc(uchar *counter)

{
  uchar uVar1;
  uchar c;
  int n;
  uchar *counter_local;
  
  n = 8;
  do {
    n = n + -1;
    uVar1 = counter[n];
    counter[n] = uVar1 + '\x01';
    if ((uchar)(uVar1 + '\x01') != '\0') {
      return;
    }
  } while (n != 0);
  return;
}

Assistant:

static void ctr64_inc(unsigned char *counter)
{
    int n = 8;
    unsigned char c;

    do {
        --n;
        c = counter[n];
        ++c;
        counter[n] = c;
        if (c > 0)
            return;
    } while (n > 0);
}